

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray
          (Extension *this,MessageLite *extendee,ExtensionSet *extension_set,int number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  size_t sVar1;
  uint8_t *puVar2;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  code *UNRECOVERED_JUMPTABLE;
  FieldType FVar3;
  uint uVar4;
  int iVar5;
  uint8_t *puVar6;
  double *pdVar7;
  const_reference pdVar8;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar9;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar10;
  const_reference plVar11;
  long *plVar12;
  int *piVar13;
  const_reference puVar14;
  uint64_t *puVar15;
  const_reference pbVar16;
  float *pfVar17;
  const_reference pfVar18;
  unsigned_long *puVar19;
  const_reference puVar20;
  const_reference piVar21;
  uint *puVar22;
  MessageLite *pMVar23;
  int i;
  int iVar24;
  string *s;
  size_type __n;
  LogMessageFatal local_40 [16];
  
  if (this->is_repeated == true) {
    if (this->is_packed == true) {
      if (*(int *)(this->cached_size).int_ != 0) {
        puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        puVar6 = WireFormatLite::WriteTagToArray(number,WIRETYPE_LENGTH_DELIMITED,puVar6);
        target = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                           (*(int32_t *)(this->cached_size).int_,puVar6);
        FVar3 = anon_unknown_58::real_type(this->type);
        switch(FVar3) {
        case TYPE_DOUBLE:
          for (iVar24 = 0; iVar5 = RepeatedField<double>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            pdVar7 = (double *)io::EpsCopyOutputStream::EnsureSpace(stream,target);
            pdVar8 = RepeatedField<double>::Get((RepeatedField<double> *)this->field_0,iVar24);
            *pdVar7 = *pdVar8;
            target = (uint8_t *)(pdVar7 + 1);
          }
          break;
        case TYPE_FLOAT:
          for (iVar24 = 0; iVar5 = RepeatedField<float>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            pfVar17 = (float *)io::EpsCopyOutputStream::EnsureSpace(stream,target);
            pfVar18 = RepeatedField<float>::Get((RepeatedField<float> *)this->field_0,iVar24);
            *pfVar17 = *pfVar18;
            target = (uint8_t *)(pfVar17 + 1);
          }
          break;
        case TYPE_INT64:
          for (iVar24 = 0; iVar5 = RepeatedField<long>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
            puVar15 = (uint64_t *)
                      RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar24);
            target = io::CodedOutputStream::WriteVarint64ToArray(*puVar15,puVar6);
          }
          break;
        case TYPE_UINT64:
          for (iVar24 = 0; iVar5 = RepeatedField<unsigned_long>::size(this->field_0), iVar24 < iVar5
              ; iVar24 = iVar24 + 1) {
            puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
            puVar20 = RepeatedField<unsigned_long>::Get
                                ((RepeatedField<unsigned_long> *)this->field_0,iVar24);
            target = io::CodedOutputStream::WriteVarint64ToArray(*puVar20,puVar6);
          }
          break;
        case TYPE_INT32:
          for (iVar24 = 0; iVar5 = RepeatedField<int>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
            piVar21 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar24);
            target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(*piVar21,puVar6);
          }
          break;
        case TYPE_FIXED64:
          for (iVar24 = 0; iVar5 = RepeatedField<unsigned_long>::size(this->field_0), iVar24 < iVar5
              ; iVar24 = iVar24 + 1) {
            puVar19 = (unsigned_long *)io::EpsCopyOutputStream::EnsureSpace(stream,target);
            puVar20 = RepeatedField<unsigned_long>::Get
                                ((RepeatedField<unsigned_long> *)this->field_0,iVar24);
            *puVar19 = *puVar20;
            target = (uint8_t *)(puVar19 + 1);
          }
          break;
        case TYPE_FIXED32:
          for (iVar24 = 0; iVar5 = RepeatedField<unsigned_int>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            puVar22 = (uint *)io::EpsCopyOutputStream::EnsureSpace(stream,target);
            puVar14 = RepeatedField<unsigned_int>::Get
                                ((RepeatedField<unsigned_int> *)this->field_0,iVar24);
            *puVar22 = *puVar14;
            target = (uint8_t *)(puVar22 + 1);
          }
          break;
        case TYPE_BOOL:
          for (iVar24 = 0; iVar5 = RepeatedField<bool>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
            pbVar16 = RepeatedField<bool>::Get((RepeatedField<bool> *)this->field_0,iVar24);
            target = WireFormatLite::WriteBoolNoTagToArray(*pbVar16,puVar6);
          }
          break;
        case TYPE_STRING:
        case TYPE_GROUP:
        case TYPE_MESSAGE:
        case TYPE_BYTES:
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                     ,0x70c);
          absl::lts_20240722::log_internal::LogMessage::operator<<
                    ((LogMessage *)local_40,(char (*) [37])"Non-primitive types can\'t be packed.");
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
        case TYPE_UINT32:
          for (iVar24 = 0; iVar5 = RepeatedField<unsigned_int>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
            puVar14 = RepeatedField<unsigned_int>::Get
                                ((RepeatedField<unsigned_int> *)this->field_0,iVar24);
            target = io::CodedOutputStream::WriteVarint32ToArray(*puVar14,puVar6);
          }
          break;
        case TYPE_ENUM:
          for (iVar24 = 0; iVar5 = RepeatedField<int>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
            piVar21 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar24);
            target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(*piVar21,puVar6);
          }
          break;
        case TYPE_SFIXED32:
          for (iVar24 = 0; iVar5 = RepeatedField<int>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            piVar13 = (int *)io::EpsCopyOutputStream::EnsureSpace(stream,target);
            piVar21 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar24);
            *piVar13 = *piVar21;
            target = (uint8_t *)(piVar13 + 1);
          }
          break;
        case TYPE_SFIXED64:
          for (iVar24 = 0; iVar5 = RepeatedField<long>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            plVar12 = (long *)io::EpsCopyOutputStream::EnsureSpace(stream,target);
            plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar24);
            *plVar12 = *plVar11;
            target = (uint8_t *)(plVar12 + 1);
          }
          break;
        case TYPE_SINT32:
          for (iVar24 = 0; iVar5 = RepeatedField<int>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
            piVar21 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar24);
            target = WireFormatLite::WriteSInt32NoTagToArray(*piVar21,puVar6);
          }
          break;
        case MAX_FIELD_TYPE:
          for (iVar24 = 0; iVar5 = RepeatedField<long>::size(this->field_0), iVar24 < iVar5;
              iVar24 = iVar24 + 1) {
            puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
            plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar24);
            target = WireFormatLite::WriteSInt64NoTagToArray(*plVar11,puVar6);
          }
        }
      }
    }
    else {
      FVar3 = anon_unknown_58::real_type(this->type);
      switch(FVar3) {
      case TYPE_DOUBLE:
        for (iVar24 = 0; iVar5 = RepeatedField<double>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          pdVar8 = RepeatedField<double>::Get((RepeatedField<double> *)this->field_0,iVar24);
          target = WireFormatLite::WriteDoubleToArray(number,*pdVar8,puVar6);
        }
        break;
      case TYPE_FLOAT:
        for (iVar24 = 0; iVar5 = RepeatedField<float>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          pfVar18 = RepeatedField<float>::Get((RepeatedField<float> *)this->field_0,iVar24);
          target = WireFormatLite::WriteFloatToArray(number,*pfVar18,puVar6);
        }
        break;
      case TYPE_INT64:
        for (iVar24 = 0; iVar5 = RepeatedField<long>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar24);
          target = WireFormatLite::WriteInt64ToArray(number,*plVar11,puVar6);
        }
        break;
      case TYPE_UINT64:
        for (iVar24 = 0; iVar5 = RepeatedField<unsigned_long>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          puVar20 = RepeatedField<unsigned_long>::Get
                              ((RepeatedField<unsigned_long> *)this->field_0,iVar24);
          target = WireFormatLite::WriteUInt64ToArray(number,*puVar20,puVar6);
        }
        break;
      case TYPE_INT32:
        for (iVar24 = 0; iVar5 = RepeatedField<int>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          piVar21 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar24);
          target = WireFormatLite::WriteInt32ToArray(number,*piVar21,puVar6);
        }
        break;
      case TYPE_FIXED64:
        for (iVar24 = 0; iVar5 = RepeatedField<unsigned_long>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          puVar20 = RepeatedField<unsigned_long>::Get
                              ((RepeatedField<unsigned_long> *)this->field_0,iVar24);
          target = WireFormatLite::WriteFixed64ToArray(number,*puVar20,puVar6);
        }
        break;
      case TYPE_FIXED32:
        for (iVar24 = 0; iVar5 = RepeatedField<unsigned_int>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          puVar14 = RepeatedField<unsigned_int>::Get
                              ((RepeatedField<unsigned_int> *)this->field_0,iVar24);
          target = WireFormatLite::WriteFixed32ToArray(number,*puVar14,puVar6);
        }
        break;
      case TYPE_BOOL:
        for (iVar24 = 0; iVar5 = RepeatedField<bool>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          pbVar16 = RepeatedField<bool>::Get((RepeatedField<bool> *)this->field_0,iVar24);
          target = WireFormatLite::WriteBoolToArray(number,*pbVar16,puVar6);
        }
        break;
      case TYPE_STRING:
        for (iVar24 = 0; iVar24 < *(int *)((this->field_0).int64_t_value + 8); iVar24 = iVar24 + 1)
        {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          pVVar9 = RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             ((RepeatedPtrFieldBase *)this->field_0,iVar24);
          sVar1 = pVVar9->_M_string_length;
          if (((long)sVar1 < 0x80) &&
             (puVar2 = stream->end_, iVar5 = io::EpsCopyOutputStream::TagSize(number * 8),
             (long)sVar1 <= (long)(puVar2 + ~(ulong)(puVar6 + iVar5) + 0x10))) {
            puVar6 = puVar6 + 2;
            for (uVar4 = number * 8 + 2; 0x7f < uVar4; uVar4 = uVar4 >> 7) {
              puVar6[-2] = (byte)uVar4 | 0x80;
              puVar6 = puVar6 + 1;
            }
            puVar6[-2] = (byte)uVar4;
            puVar6[-1] = (uint8_t)sVar1;
            memcpy(puVar6,(pVVar9->_M_dataplus)._M_p,sVar1);
            target = puVar6 + sVar1;
          }
          else {
            target = io::EpsCopyOutputStream::WriteStringOutline(stream,number,pVVar9,puVar6);
          }
        }
        break;
      case TYPE_GROUP:
        for (iVar24 = 0; iVar24 < *(int *)((this->field_0).int64_t_value + 8); iVar24 = iVar24 + 1)
        {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          pVVar10 = RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                              ((RepeatedPtrFieldBase *)this->field_0,iVar24);
          target = WireFormatLite::InternalWriteGroup(number,pVVar10,puVar6,stream);
        }
        break;
      case TYPE_MESSAGE:
        for (iVar24 = 0;
            iVar24 < ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value)->current_size_;
            iVar24 = iVar24 + 1) {
          pVVar10 = RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                              ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value,iVar24);
          iVar5 = MessageLite::GetCachedSize(pVVar10);
          target = WireFormatLite::InternalWriteMessage(number,pVVar10,iVar5,target,stream);
        }
        break;
      case TYPE_BYTES:
        for (iVar24 = 0; iVar24 < *(int *)((this->field_0).int64_t_value + 8); iVar24 = iVar24 + 1)
        {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          pVVar9 = RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             ((RepeatedPtrFieldBase *)this->field_0,iVar24);
          sVar1 = pVVar9->_M_string_length;
          if (((long)sVar1 < 0x80) &&
             (puVar2 = stream->end_, iVar5 = io::EpsCopyOutputStream::TagSize(number * 8),
             (long)sVar1 <= (long)(puVar2 + ~(ulong)(puVar6 + iVar5) + 0x10))) {
            puVar6 = puVar6 + 2;
            for (uVar4 = number * 8 + 2; 0x7f < uVar4; uVar4 = uVar4 >> 7) {
              puVar6[-2] = (byte)uVar4 | 0x80;
              puVar6 = puVar6 + 1;
            }
            puVar6[-2] = (byte)uVar4;
            puVar6[-1] = (uint8_t)sVar1;
            memcpy(puVar6,(pVVar9->_M_dataplus)._M_p,sVar1);
            target = puVar6 + sVar1;
          }
          else {
            target = io::EpsCopyOutputStream::WriteStringOutline(stream,number,pVVar9,puVar6);
          }
        }
        break;
      case TYPE_UINT32:
        for (iVar24 = 0; iVar5 = RepeatedField<unsigned_int>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          puVar14 = RepeatedField<unsigned_int>::Get
                              ((RepeatedField<unsigned_int> *)this->field_0,iVar24);
          target = WireFormatLite::WriteUInt32ToArray(number,*puVar14,puVar6);
        }
        break;
      case TYPE_ENUM:
        for (iVar24 = 0; iVar5 = RepeatedField<int>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          piVar21 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar24);
          target = WireFormatLite::WriteEnumToArray(number,*piVar21,puVar6);
        }
        break;
      case TYPE_SFIXED32:
        for (iVar24 = 0; iVar5 = RepeatedField<int>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          piVar21 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar24);
          target = WireFormatLite::WriteSFixed32ToArray(number,*piVar21,puVar6);
        }
        break;
      case TYPE_SFIXED64:
        for (iVar24 = 0; iVar5 = RepeatedField<long>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar24);
          target = WireFormatLite::WriteSFixed64ToArray(number,*plVar11,puVar6);
        }
        break;
      case TYPE_SINT32:
        for (iVar24 = 0; iVar5 = RepeatedField<int>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          piVar21 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar24);
          target = WireFormatLite::WriteSInt32ToArray(number,*piVar21,puVar6);
        }
        break;
      case MAX_FIELD_TYPE:
        for (iVar24 = 0; iVar5 = RepeatedField<long>::size(this->field_0), iVar24 < iVar5;
            iVar24 = iVar24 + 1) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
          plVar11 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar24);
          target = WireFormatLite::WriteSInt64ToArray(number,*plVar11,puVar6);
        }
      }
    }
  }
  else if ((this->field_0xa & 2) == 0) {
    FVar3 = anon_unknown_58::real_type(this->type);
    switch(FVar3) {
    case TYPE_DOUBLE:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteDoubleToArray(number,(this->field_0).double_value,puVar6);
      return puVar6;
    case TYPE_FLOAT:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteFloatToArray(number,(this->field_0).float_value,puVar6);
      return puVar6;
    case TYPE_INT64:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteInt64ToArray(number,(this->field_0).int64_t_value,puVar6);
      return puVar6;
    case TYPE_UINT64:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteUInt64ToArray(number,(this->field_0).uint64_t_value,puVar6);
      return puVar6;
    case TYPE_INT32:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteInt32ToArray(number,(this->field_0).int32_t_value,puVar6);
      return puVar6;
    case TYPE_FIXED64:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteFixed64ToArray(number,(this->field_0).uint64_t_value,puVar6);
      return puVar6;
    case TYPE_FIXED32:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteFixed32ToArray(number,(this->field_0).uint32_t_value,puVar6);
      return puVar6;
    case TYPE_BOOL:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteBoolToArray(number,(this->field_0).bool_value,puVar6);
      return puVar6;
    case TYPE_STRING:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      s = (string *)(this->field_0).int64_t_value;
      __n = s->_M_string_length;
      if (0x7f < (long)__n) {
LAB_002329f4:
        puVar6 = io::EpsCopyOutputStream::WriteStringOutline(stream,number,s,puVar6);
        return puVar6;
      }
      puVar2 = stream->end_;
      iVar24 = io::EpsCopyOutputStream::TagSize(number * 8);
      if ((long)(puVar2 + ~(ulong)(puVar6 + iVar24) + 0x10) < (long)__n) goto LAB_002329f4;
      puVar6 = puVar6 + 2;
      for (uVar4 = number * 8 | 2; 0x7f < uVar4; uVar4 = uVar4 >> 7) {
        puVar6[-2] = (byte)uVar4 | 0x80;
        puVar6 = puVar6 + 1;
      }
      break;
    case TYPE_GROUP:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::InternalWriteGroup(number,(MessageLite *)this->field_0,puVar6,stream)
      ;
      return puVar6;
    case TYPE_MESSAGE:
      if ((this->field_0xa & 4) != 0) {
        pMVar23 = GetPrototypeForLazyMessage(extension_set,extendee,number);
        UNRECOVERED_JUMPTABLE = *(code **)(**(long **)&(this->field_0).int32_t_value + 0x98);
        puVar6 = (uint8_t *)
                 (*UNRECOVERED_JUMPTABLE)
                           (*(long **)&(this->field_0).int32_t_value,pMVar23,number,target,stream,
                            UNRECOVERED_JUMPTABLE);
        return puVar6;
      }
      this_00 = this->field_0;
      iVar24 = MessageLite::GetCachedSize(this_00);
      puVar6 = WireFormatLite::InternalWriteMessage
                         (number,(MessageLite *)this_00,iVar24,target,stream);
      return puVar6;
    case TYPE_BYTES:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      s = (string *)(this->field_0).int64_t_value;
      __n = s->_M_string_length;
      if (0x7f < (long)__n) goto LAB_002329f4;
      puVar2 = stream->end_;
      iVar24 = io::EpsCopyOutputStream::TagSize(number * 8);
      if ((long)(puVar2 + ~(ulong)(puVar6 + iVar24) + 0x10) < (long)__n) goto LAB_002329f4;
      puVar6 = puVar6 + 2;
      for (uVar4 = number * 8 | 2; 0x7f < uVar4; uVar4 = uVar4 >> 7) {
        puVar6[-2] = (byte)uVar4 | 0x80;
        puVar6 = puVar6 + 1;
      }
      break;
    case TYPE_UINT32:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteUInt32ToArray(number,(this->field_0).uint32_t_value,puVar6);
      return puVar6;
    case TYPE_ENUM:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteEnumToArray(number,(this->field_0).enum_value,puVar6);
      return puVar6;
    case TYPE_SFIXED32:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteSFixed32ToArray(number,(this->field_0).int32_t_value,puVar6);
      return puVar6;
    case TYPE_SFIXED64:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteSFixed64ToArray(number,(this->field_0).int64_t_value,puVar6);
      return puVar6;
    case TYPE_SINT32:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteSInt32ToArray(number,(this->field_0).int32_t_value,puVar6);
      return puVar6;
    case MAX_FIELD_TYPE:
      puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar6 = WireFormatLite::WriteSInt64ToArray(number,(this->field_0).int64_t_value,puVar6);
      return puVar6;
    default:
      goto switchD_00231cd5_default;
    }
    puVar6[-2] = (uint8_t)uVar4;
    puVar6[-1] = (uint8_t)__n;
    memcpy(puVar6,(s->_M_dataplus)._M_p,__n);
    target = puVar6 + __n;
  }
switchD_00231cd5_default:
  return (uint8_t *)(double *)target;
}

Assistant:

uint8_t* ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray(
    const MessageLite* extendee, const ExtensionSet* extension_set, int number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size() == 0) return target;

      target = stream->EnsureSpace(target);
      target = WireFormatLite::WriteTagToArray(
          number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
      target = WireFormatLite::WriteInt32NoTagToArray(cached_size(), target);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##NoTagToArray(           \
          ptr.repeated_##LOWERCASE##_value->Get(i), target);             \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##ToArray(                \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = stream->WriteString(                                      \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
#undef HANDLE_TYPE
        case WireFormatLite::TYPE_GROUP:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            target = stream->EnsureSpace(target);
            target = WireFormatLite::InternalWriteGroup(
                number, ptr.repeated_message_value->Get(i), target, stream);
          }
          break;
        case WireFormatLite::TYPE_MESSAGE:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            auto& msg = ptr.repeated_message_value->Get(i);
            target = WireFormatLite::InternalWriteMessage(
                number, msg, msg.GetCachedSize(), target, stream);
          }
          break;
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                               \
  case WireFormatLite::TYPE_##UPPERCASE:                                       \
    target = stream->EnsureSpace(target);                                      \
    target = WireFormatLite::Write##CAMELCASE##ToArray(number, VALUE, target); \
    break

      HANDLE_TYPE(INT32, Int32, int32_t_value);
      HANDLE_TYPE(INT64, Int64, int64_t_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_t_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_t_value);
      HANDLE_TYPE(SINT32, SInt32, int32_t_value);
      HANDLE_TYPE(SINT64, SInt64, int64_t_value);
      HANDLE_TYPE(FIXED32, Fixed32, uint32_t_value);
      HANDLE_TYPE(FIXED64, Fixed64, uint64_t_value);
      HANDLE_TYPE(SFIXED32, SFixed32, int32_t_value);
      HANDLE_TYPE(SFIXED64, SFixed64, int64_t_value);
      HANDLE_TYPE(FLOAT, Float, float_value);
      HANDLE_TYPE(DOUBLE, Double, double_value);
      HANDLE_TYPE(BOOL, Bool, bool_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)         \
  case WireFormatLite::TYPE_##UPPERCASE:                 \
    target = stream->EnsureSpace(target);                \
    target = stream->WriteString(number, VALUE, target); \
    break
      HANDLE_TYPE(STRING, String, *ptr.string_value);
      HANDLE_TYPE(BYTES, Bytes, *ptr.string_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_GROUP:
        target = stream->EnsureSpace(target);
        target = WireFormatLite::InternalWriteGroup(number, *ptr.message_value,
                                                    target, stream);
        break;
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          const auto* prototype =
              extension_set->GetPrototypeForLazyMessage(extendee, number);
          target = ptr.lazymessage_value->WriteMessageToArray(prototype, number,
                                                              target, stream);
        } else {
          target = WireFormatLite::InternalWriteMessage(
              number, *ptr.message_value, ptr.message_value->GetCachedSize(),
              target, stream);
        }
        break;
    }
  }
  return target;
}